

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O0

TestStatus *
vkt::tessellation::anon_unknown_1::GLPosition::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseType caseType)

{
  TestContext *this;
  Archive *archive;
  ConstPixelBufferAccess local_88;
  undefined4 local_60;
  undefined4 local_5c;
  int outPatchSize;
  int inPatchSize;
  int numPrimitives;
  undefined1 local_48 [8];
  TextureLevel referenceImage;
  CaseType caseType_local;
  Context *context_local;
  
  referenceImage.m_data.m_cap._4_4_ = caseType;
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_48);
  this = Context::getTestContext(context);
  archive = tcu::TestContext::getArchive(this);
  tcu::ImageIO::loadPNG
            ((TextureLevel *)local_48,archive,"vulkan/data/tessellation/gl_position_ref.png");
  outPatchSize = 1;
  local_5c = 3;
  local_60 = 3;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_88,(TextureLevel *)local_48);
  runTest(__return_storage_ptr__,context,1,3,3,VK_FORMAT_R32G32B32A32_SFLOAT,test::vertexData,0x30,
          &local_88);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_48);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseType caseType)
{
	DE_UNREF(caseType);

	// Input vertex attribute data
	static const float vertexData[3*4] =
	{
		-0.8f, -0.7f, 0.1f, 0.7f,
		-0.5f,  0.4f, 0.2f, 0.5f,
		 0.3f,  0.2f, 0.3f, 0.45f
	};

	tcu::TextureLevel referenceImage;
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), "vulkan/data/tessellation/gl_position_ref.png");

	const int numPrimitives = 1;
	const int inPatchSize   = 3;
	const int outPatchSize  = 3;

	return runTest(context, numPrimitives, inPatchSize, outPatchSize,
				   VK_FORMAT_R32G32B32A32_SFLOAT, vertexData, sizeof(vertexData), referenceImage.getAccess());
}